

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

bool __thiscall Rml::Element::IsVisible(Element *this,bool include_ancestors)

{
  Element *local_28;
  Element *element;
  bool include_ancestors_local;
  Element *this_local;
  
  local_28 = this;
  if (include_ancestors) {
    for (; local_28 != (Element *)0x0; local_28 = local_28->parent) {
      if ((local_28->visible & 1U) == 0) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = (bool)(this->visible & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool Element::IsVisible(bool include_ancestors) const
{
	if (!include_ancestors)
		return visible;
	const Element* element = this;
	while (element)
	{
		if (!element->visible)
			return false;
		element = element->parent;
	}
	return true;
}